

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledInputFile::Data::~Data(Data *this)

{
  value_type pTVar1;
  Header *pHVar2;
  reference ppTVar3;
  long in_RDI;
  size_t i;
  TileBuffer *in_stack_ffffffffffffffc0;
  Header *this_00;
  Header *local_10;
  
  if (*(void **)(in_RDI + 200) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 200));
  }
  if (*(void **)(in_RDI + 0xd0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xd0));
  }
  local_10 = (Header *)0x0;
  while (this_00 = local_10,
        pHVar2 = (Header *)
                 std::
                 vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         *)(in_RDI + 0x148)), this_00 < pHVar2) {
    ppTVar3 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(in_RDI + 0x148),(size_type)local_10);
    pTVar1 = *ppTVar3;
    if (pTVar1 != (value_type)0x0) {
      anon_unknown_8::TileBuffer::~TileBuffer(in_stack_ffffffffffffffc0);
      operator_delete(pTVar1,0x80);
    }
    local_10 = (Header *)&(local_10->_map)._M_t._M_impl.field_0x1;
  }
  if (((*(byte *)(in_RDI + 0x134) & 1) != 0) && (*(long **)(in_RDI + 0x140) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x140) + 8))();
  }
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::~vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
             *)this_00);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ::~vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
             *)this_00);
  TileOffsets::~TileOffsets((TileOffsets *)0x8c96a5);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x8c96b3);
  Header::~Header(this_00);
  return;
}

Assistant:

TiledInputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        delete tileBuffers[i];

    if (multiPartBackwardSupport)
        delete multiPartFile;
}